

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

void xmlTextWriterStartDocumentCallback(void *ctx)

{
  htmlDocPtr pxVar1;
  xmlDocPtr pxVar2;
  xmlChar *pxVar3;
  
  pxVar2 = *(xmlDocPtr *)((long)ctx + 0x10);
  if (*(int *)((long)ctx + 0x34) == 0) {
    if (pxVar2 == (xmlDocPtr)0x0) {
      pxVar2 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(xmlDocPtr *)((long)ctx + 0x10) = pxVar2;
    }
    if (pxVar2 != (xmlDocPtr)0x0) {
      if (pxVar2->children == (_xmlNode *)0x0) {
        if (*(xmlChar **)((long)ctx + 0x28) == (xmlChar *)0x0) {
          pxVar3 = (xmlChar *)0x0;
        }
        else {
          pxVar3 = xmlStrdup(*(xmlChar **)((long)ctx + 0x28));
        }
        pxVar2->encoding = pxVar3;
        pxVar2->standalone = *(int *)((long)ctx + 0x30);
      }
      goto LAB_001b77c9;
    }
  }
  else {
    if (pxVar2 == (xmlDocPtr)0x0) {
      pxVar1 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
      *(htmlDocPtr *)((long)ctx + 0x10) = pxVar1;
    }
    if (*(long *)((long)ctx + 0x10) != 0) {
LAB_001b77c9:
      if ((((*(long *)((long)ctx + 0x10) != 0) &&
           (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0)) &&
          (*(long *)((long)ctx + 0x38) != 0)) &&
         (pxVar3 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8), pxVar3 != (xmlChar *)0x0)) {
        pxVar3 = xmlCanonicPath(pxVar3);
        *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar3;
        if (pxVar3 == (xmlChar *)0x0) {
          pxVar3 = xmlStrdup(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
          *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar3;
        }
      }
      return;
    }
  }
  xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
  return;
}

Assistant:

static void
xmlTextWriterStartDocumentCallback(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        if (ctxt->myDoc == NULL)
            ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
        if (ctxt->myDoc == NULL) {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    } else
#endif
    {
        doc = ctxt->myDoc;
        if (doc == NULL)
            doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
        if (doc != NULL) {
            if (doc->children == NULL) {
                if (ctxt->encoding != NULL)
                    doc->encoding = xmlStrdup(ctxt->encoding);
                else
                    doc->encoding = NULL;
                doc->standalone = ctxt->standalone;
            }
        } else {
            xmlCtxtErrMemory(ctxt);
            return;
        }
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
        (ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
        ctxt->myDoc->URL =
            xmlCanonicPath((const xmlChar *) ctxt->input->filename);
        if (ctxt->myDoc->URL == NULL)
            ctxt->myDoc->URL =
                xmlStrdup((const xmlChar *) ctxt->input->filename);
    }
}